

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O1

SRes SzReadAndDecodePackedStreams
               (ILookInStream *inStream,CSzData *sd,CBuf *tempBufs,UInt32 numFoldersMax,
               UInt64 baseOffset,CSzAr *p,ISzAlloc *allocTemp)

{
  size_t sVar1;
  UInt64 startPos;
  ILookInStream *inStream_00;
  SRes SVar2;
  SRes SVar3;
  Byte *pBVar4;
  ulong uVar5;
  SRes SVar6;
  ulong uVar7;
  size_t *psVar8;
  bool bVar9;
  UInt64 dataStartPos;
  CSubStreamInfo ssi;
  CSubStreamInfo *ssi_00;
  ISzAlloc *in_stack_ffffffffffffff60;
  UInt64 local_88;
  UInt64 local_80;
  ILookInStream *local_78;
  UInt64 local_70;
  CSubStreamInfo local_68;
  
  local_88 = 0;
  ssi_00 = &local_68;
  SVar2 = SzReadStreamsInfo(p,sd,numFoldersMax,(CBuf *)0x0,0,&local_88,ssi_00,
                            in_stack_ffffffffffffff60);
  if (SVar2 == 0) {
    uVar5 = (ulong)p->NumFolders;
    if (uVar5 == 0) {
      SVar2 = 0x10;
    }
    else {
      SVar2 = 4;
      if (p->NumFolders <= numFoldersMax) {
        local_88 = baseOffset + local_88;
        uVar7 = 0;
        local_80 = local_88;
        local_78 = inStream;
        memset(tempBufs,0,uVar5 << 4);
        psVar8 = &tempBufs->size;
        do {
          sVar1 = p->CoderUnpackSizes
                  [(uint)p->FoToMainUnpackSizeIndex[uVar7] + p->FoToCoderUnpackSizes[uVar7]];
          *psVar8 = 0;
          if (sVar1 == 0) {
            ((CBuf *)(psVar8 + -1))->data = (Byte *)0x0;
            bVar9 = false;
          }
          else {
            pBVar4 = (Byte *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,sVar1);
            ((CBuf *)(psVar8 + -1))->data = pBVar4;
            bVar9 = pBVar4 == (Byte *)0x0;
            if (!bVar9) {
              *psVar8 = sVar1;
            }
          }
          inStream_00 = local_78;
          startPos = local_80;
          if (bVar9) {
            return 2;
          }
          uVar7 = uVar7 + 1;
          psVar8 = psVar8 + 2;
        } while (uVar5 != uVar7);
        psVar8 = &tempBufs->size;
        uVar7 = 0;
        SVar6 = 0;
        do {
          local_70 = startPos;
          bVar9 = false;
          SVar2 = (*inStream_00->Seek)(inStream_00,(Int64 *)&local_70,SZ_SEEK_SET);
          if (SVar2 == 0) {
            SVar3 = SzAr_DecodeFolder(p,(UInt32)uVar7,inStream_00,startPos,
                                      ((CBuf *)(psVar8 + -1))->data,*psVar8,(ISzAlloc *)ssi_00);
            bVar9 = SVar3 == 0;
            SVar2 = SVar6;
            if (!bVar9) {
              SVar2 = SVar3;
            }
          }
          SVar6 = SVar2;
          if (!bVar9) {
            return SVar6;
          }
          uVar7 = uVar7 + 1;
          psVar8 = psVar8 + 2;
          SVar2 = 0;
        } while (uVar5 != uVar7);
      }
    }
  }
  return SVar2;
}

Assistant:

static SRes SzReadAndDecodePackedStreams(
    ILookInStream *inStream,
    CSzData *sd,
    CBuf *tempBufs,
    UInt32 numFoldersMax,
    UInt64 baseOffset,
    CSzAr *p,
    ISzAlloc *allocTemp)
{
  UInt64 dataStartPos = 0;
  UInt32 fo;
  CSubStreamInfo ssi;
  UInt32 numFolders;

  RINOK(SzReadStreamsInfo(p, sd, numFoldersMax, NULL, 0, &dataStartPos, &ssi, allocTemp));

  numFolders = p->NumFolders;
  if (numFolders == 0)
    return SZ_ERROR_ARCHIVE;
  else if (numFolders > numFoldersMax)
    return SZ_ERROR_UNSUPPORTED;

  dataStartPos += baseOffset;

  for (fo = 0; fo < numFolders; fo++)
    Buf_Init(tempBufs + fo);
  
  for (fo = 0; fo < numFolders; fo++)
  {
    CBuf *tempBuf = tempBufs + fo;
    UInt64 unpackSize = SzAr_GetFolderUnpackSize(p, fo);
    if ((size_t)unpackSize != unpackSize)
      return SZ_ERROR_MEM;
    if (!Buf_Create(tempBuf, (size_t)unpackSize, allocTemp))
      return SZ_ERROR_MEM;
  }
  
  for (fo = 0; fo < numFolders; fo++)
  {
    const CBuf *tempBuf = tempBufs + fo;
    RINOK(LookInStream_SeekTo(inStream, dataStartPos));
    RINOK(SzAr_DecodeFolder(p, fo, inStream, dataStartPos, tempBuf->data, tempBuf->size, allocTemp));
  }
  
  return SZ_OK;
}